

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O1

int process_ret_type(c2m_ctx_t c2m_ctx,type *ret_type,MIR_type_t *qword_types)

{
  MIR_type_t MVar1;
  int n;
  int iVar2;
  int in_ECX;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  n = classify_arg(c2m_ctx,ret_type,qword_types,in_ECX);
  iVar5 = 0;
  if ((n != 0 && (ret_type->mode & ~TM_BASIC) == TM_STRUCT) &&
     (update_last_qword_type(c2m_ctx,ret_type,qword_types,n), iVar5 = n, 0 < n)) {
    lVar3 = 0;
    iVar6 = 0;
    iVar4 = 0;
    iVar2 = 0;
    iVar5 = 0;
    do {
      MVar1 = qword_types[lVar3];
      iVar7 = iVar5 + 1;
      qword_types[iVar5] = MVar1;
      if ((int)MVar1 < 8) {
        if ((int)MVar1 < 4) {
          if ((MVar1 != MIR_T_I8) && (MVar1 != MIR_T_I16)) {
LAB_0019cb7e:
            __assert_fail("FALSE",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                          ,0xa6,"int process_ret_type(c2m_ctx_t, struct type *, MIR_type_t *)");
          }
        }
        else if ((MVar1 != MIR_T_I32) && (MVar1 != MIR_T_I64)) goto LAB_0019cb7e;
        iVar2 = iVar2 + 1;
      }
      else if (MVar1 - MIR_T_F < 2) {
        iVar4 = iVar4 + 1;
      }
      else if (MVar1 == MIR_T_LD) {
        iVar6 = iVar6 + 1;
      }
      else {
        if (MVar1 != 0x15) goto LAB_0019cb7e;
        n = n + -1;
        iVar7 = iVar5;
      }
      lVar3 = lVar3 + 1;
      iVar5 = iVar7;
    } while (lVar3 < n);
    iVar5 = n;
    if (1 < iVar6) {
      iVar5 = 0;
    }
    if (2 < iVar4) {
      iVar5 = 0;
    }
    if (2 < iVar2) {
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

static int process_ret_type (c2m_ctx_t c2m_ctx, struct type *ret_type,
                             MIR_type_t qword_types[MAX_QWORDS]) {
  MIR_type_t type;
  int n, n_iregs, n_fregs, n_stregs, curr;
  int n_qwords = classify_arg (c2m_ctx, ret_type, qword_types, FALSE);

  if (ret_type->mode != TM_STRUCT && ret_type->mode != TM_UNION) return 0;
  if (n_qwords != 0) {
    update_last_qword_type (c2m_ctx, ret_type, qword_types, n_qwords);
    n_iregs = n_fregs = n_stregs = curr = 0;
    for (n = 0; n < n_qwords; n++) { /* start from the last qword */
      type = qword_types[n];
      qword_types[curr++] = type;
      switch ((int) type) {
      case MIR_T_I8:
      case MIR_T_I16:
      case MIR_T_I32:
      case MIR_T_I64: n_iregs++; break;
      case MIR_T_F:
      case MIR_T_D: n_fregs++; break;
      case MIR_T_LD: n_stregs++; break;
      case X87UP_CLASS:
        n_qwords--;
        curr--;
        break;
      default: assert (FALSE);
      }
    }
    if (n_iregs > 2 || n_fregs > 2 || n_stregs > 1) n_qwords = 0;
  }
  return n_qwords;
}